

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

ON_RTreeNode * __thiscall ON_RTreeMemPool::AllocNode(ON_RTreeMemPool *this)

{
  size_t node_sz;
  ON_RTreeNode *node;
  ON_RTreeMemPool *this_local;
  
  node_sz = (size_t)this->m_nodes;
  if ((Blk *)node_sz == (Blk *)0x0) {
    if (this->m_buffer_capacity < 0x158) {
      GrowBuffer(this);
    }
    node_sz = (size_t)this->m_buffer;
    if ((uchar *)node_sz == (uchar *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_rtree.cpp"
                 ,0xf2,"","ON_RTreeMemPool::AllocNode() - out of memory");
      return (ON_RTreeNode *)0x0;
    }
    this->m_buffer = this->m_buffer + 0x158;
    this->m_buffer_capacity = this->m_buffer_capacity - 0x158;
  }
  else {
    this->m_nodes = this->m_nodes->m_next;
  }
  *(undefined4 *)(node_sz + 4) = 0;
  *(undefined4 *)node_sz = 0xffffffff;
  return (ON_RTreeNode *)node_sz;
}

Assistant:

ON_RTreeNode* ON_RTreeMemPool::AllocNode()
{
  ON_RTreeNode* node = (ON_RTreeNode*)m_nodes;
  if ( node )
  {
    m_nodes = m_nodes->m_next;
  }
  else
  {
    const size_t node_sz = sizeof(*node);
    if ( m_buffer_capacity < node_sz )
      GrowBuffer();

    if ( 0 == (node = (ON_RTreeNode*)m_buffer) )
    {
      ON_ERROR("ON_RTreeMemPool::AllocNode() - out of memory");
      return 0;
    }

    m_buffer += node_sz;
    m_buffer_capacity -= node_sz;
  }

  // initialize node
  node->m_count = 0;
  node->m_level = -1;

  return node;
}